

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_types.cc
# Opt level: O3

int32_t draco::DataTypeLength(DataType dt)

{
  int32_t iVar1;
  
  iVar1 = -1;
  if (dt - DT_INT8 < 0xb) {
    iVar1 = *(int32_t *)(&DAT_001a5ccc + (ulong)(dt - DT_INT8) * 4);
  }
  return iVar1;
}

Assistant:

int32_t DataTypeLength(DataType dt) {
  switch (dt) {
    case DT_INT8:
    case DT_UINT8:
      return 1;
    case DT_INT16:
    case DT_UINT16:
      return 2;
    case DT_INT32:
    case DT_UINT32:
      return 4;
    case DT_INT64:
    case DT_UINT64:
      return 8;
    case DT_FLOAT32:
      return 4;
    case DT_FLOAT64:
      return 8;
    case DT_BOOL:
      return 1;
    default:
      return -1;
  }
}